

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

ptls_hash_context_t * sha256_create(void)

{
  ptls_hash_context_t *ppVar1;
  
  ppVar1 = (ptls_hash_context_t *)malloc(0x80);
  if (ppVar1 != (ptls_hash_context_t *)0x0) {
    ppVar1->update = sha256_update;
    ppVar1->final = sha256_final;
    cf_sha256_init((cf_sha256_context *)(ppVar1 + 1));
  }
  return ppVar1;
}

Assistant:

static ptls_hash_context_t *sha256_create(void)
{
    struct sha256_context_t *ctx;

    if ((ctx = malloc(sizeof(*ctx))) == NULL)
        return NULL;
    ctx->super = (ptls_hash_context_t){sha256_update, sha256_final};
    cf_sha256_init(&ctx->ctx);
    return &ctx->super;
}